

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawn_location.hpp
# Opt level: O0

void __thiscall SpawnLocation::apply_json(SpawnLocation *this,Json *json)

{
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar1;
  bool bVar2;
  uchar uVar3;
  unsigned_short uVar4;
  const_reference pvVar5;
  allocator<char> local_131;
  key_type local_130;
  allocator<char> local_109;
  key_type local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  key_type local_98;
  allocator<char> local_71;
  key_type local_70;
  allocator<char> local_39;
  key_type local_38;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_18;
  Json *json_local;
  SpawnLocation *this_local;
  
  local_18 = json;
  json_local = (Json *)this;
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[6],_0>(json,(char (*) [6])"mapId");
  pbVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mapId",&local_39);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar1,&local_38);
    uVar4 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_unsigned_short<unsigned_short,_0>(pvVar5);
    this->_map_id = uVar4;
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[5],_0>(local_18,(char (*) [5])"posX");
  pbVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"posX",&local_71);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar1,&local_70);
    uVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_unsigned_char<unsigned_char,_0>(pvVar5);
    this->_pos_x = uVar3;
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[5],_0>(local_18,(char (*) [5])"posY");
  pbVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"posY",&local_99);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar1,&local_98);
    uVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_unsigned_char<unsigned_char,_0>(pvVar5);
    this->_pos_y = uVar3;
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[12],_0>(local_18,(char (*) [12])"orientation");
  pbVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"orientation",&local_c1);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar1,&local_c0);
    uVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_unsigned_char<unsigned_char,_0>(pvVar5);
    this->_orientation = uVar3;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(local_18,(char (*) [7])"nodeId");
  pbVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"nodeId",&local_109);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar1,&local_108);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_e8,pvVar5);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->_node_id,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[13],_0>(local_18,(char (*) [13])"startingLife");
  pbVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"startingLife",&local_131);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar1,&local_130);
    uVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_unsigned_char<unsigned_char,_0>(pvVar5);
    this->_starting_life = uVar3;
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  return;
}

Assistant:

void apply_json(const Json& json)
    {
        if(json.contains("mapId"))
            _map_id = json.at("mapId");
        if(json.contains("posX"))
            _pos_x = json.at("posX");
        if(json.contains("posY"))
            _pos_y = json.at("posY");
        if(json.contains("orientation"))
            _orientation = json.at("orientation");
        if(json.contains("nodeId"))
            _node_id = json.at("nodeId");
        if(json.contains("startingLife"))
            _starting_life = json.at("startingLife");        
    }